

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
gmlc::utilities::base64_decode
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          utilities *this,string_view encoded_string,size_t offset)

{
  utilities uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong in_RAX;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uchar *__x;
  utilities *puVar10;
  bool bVar11;
  array<unsigned_char,_4UL> char_array_4;
  array<unsigned_char,_3UL> char_array_3;
  undefined1 uStack_31;
  
  _char_array_4 = in_RAX & 0xff00000000000000;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,
             (ulong)((long)(this + ~(ulong)encoded_string._M_str) * 4) / 3 + 2);
  __x = char_array_3._M_elems;
  for (puVar10 = (utilities *)0x0; uVar9 = _char_array_4,
      this + ~(ulong)encoded_string._M_str != puVar10; puVar10 = puVar10 + 1) {
    uVar1 = puVar10[encoded_string._M_len + (long)(int)encoded_string._M_str];
    if (((ulong)(byte)uVar1 == 0x3d) || (b64Map[(byte)uVar1] == -1)) break;
    lVar7 = (long)(int)uVar8;
    uVar8 = uVar8 + 1;
    *(utilities *)(char_array_4._M_elems + lVar7) = uVar1;
    uVar9 = _char_array_4;
    if (uVar8 == 4) {
      uVar6 = _char_array_4 & 0xff;
      bVar2 = b64Map[_char_array_4 >> 8 & 0xff];
      bVar3 = b64Map[uVar9 >> 0x10 & 0xff];
      char_array_4._M_elems =
           (_Type)CONCAT13(b64Map[uVar9 >> 0x18 & 0xff],
                           (BADTYPE)CONCAT12(bVar3,(BADTYPE)CONCAT11(bVar2,b64Map[uVar6])));
      _char_array_4 = CONCAT14(bVar2 >> 4 & 3 | b64Map[uVar6] << 2,char_array_4._M_elems);
      _char_array_4 = CONCAT15(bVar3 >> 2 & 0xf | bVar2 << 4,_char_array_4);
      uStack_31 = SUB81(uVar9,7);
      _char_array_4 = CONCAT16(bVar3 * '@' + b64Map[uVar9 >> 0x18 & 0xff],_char_array_4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,__x);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,char_array_3._M_elems + 1);
      uVar8 = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,char_array_3._M_elems + 2);
    }
  }
  if (0 < (int)uVar8) {
    for (uVar6 = (ulong)uVar8; (int)uVar6 < 4; uVar6 = uVar6 + 1) {
      char_array_4._M_elems[uVar6] = '\0';
    }
    uVar6 = _char_array_4 >> 8;
    uVar4 = _char_array_4 >> 0x10;
    uVar5 = _char_array_4 >> 0x18;
    _char_array_4 =
         CONCAT14((byte)b64Map[uVar6 & 0xff] >> 4 & 3 | b64Map[_char_array_4 & 0xff] << 2,
                  char_array_4._M_elems);
    _char_array_4 =
         CONCAT15((byte)b64Map[uVar4 & 0xff] >> 2 & 0xf | b64Map[uVar6 & 0xff] << 4,_char_array_4);
    uStack_31 = SUB81(uVar9,7);
    _char_array_4 = CONCAT16(b64Map[uVar4 & 0xff] * '@' + b64Map[uVar5 & 0xff],_char_array_4);
    uVar9 = (ulong)(uVar8 - 1);
    while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,__x);
      __x = __x + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char>
    base64_decode(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size() - offset - 1;
    int indexOut = 0;
    int indexIn = static_cast<int>(offset);
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::vector<unsigned char> ret;
    ret.reserve((in_len * 4) / 3 + 2);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}